

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void colors_modify(char *title,wchar_t row)

{
  keycode_t kVar1;
  char *pcVar2;
  color_type *pcVar3;
  ulong uVar4;
  ulong uVar5;
  wchar_t x;
  keypress kVar6;
  
  prt("Command: Modify colors",L'\b',L'\0');
  do {
    clear_from(L'\n');
    pcVar3 = color_table;
    x = L'\0';
    for (uVar4 = 0; uVar4 != 0x1e; uVar4 = uVar4 + 1) {
      Term_putstr(x,L'\x14',L'\xffffffff',(uint)colors_modify::a,"##");
      pcVar2 = format(" %c",(ulong)(uint)(int)pcVar3->index_char);
      Term_putstr(x,L'\x15',L'\xffffffff',(wchar_t)uVar4,pcVar2);
      pcVar2 = format("%2d",uVar4 & 0xffffffff);
      Term_putstr(x,L'\x16',L'\xffffffff',(wchar_t)uVar4,pcVar2);
      x = x + L'\x03';
      pcVar3 = pcVar3 + 1;
    }
    uVar5 = (ulong)colors_modify::a;
    pcVar2 = (char *)(uVar5 * 0x2a + 0x28ffa1);
    uVar4 = 0x3f;
    if (uVar5 < 0x1e) {
      uVar4 = (ulong)(uint)(int)color_table[uVar5].index_char;
    }
    else {
      pcVar2 = "undefined";
    }
    pcVar2 = format("Color = %d, Name = %s, Index = %c",uVar5,pcVar2,uVar4);
    Term_putstr(L'\x05',L'\n',L'\xffffffff',L'\x01',pcVar2);
    uVar4 = (ulong)colors_modify::a;
    pcVar2 = format("K = 0x%02x / R,G,B = 0x%02x,0x%02x,0x%02x",(ulong)angband_color_table[uVar4][0]
                    ,(ulong)angband_color_table[uVar4][1],(ulong)angband_color_table[uVar4][2],
                    (ulong)angband_color_table[uVar4][3]);
    Term_putstr(L'\x05',L'\f',L'\xffffffff',L'\x01',pcVar2);
    Term_putstr(L'\0',L'\x0e',L'\xffffffff',L'\x01',"Command (n/N/k/K/r/R/g/G/b/B): ");
    kVar6 = inkey();
    if (kVar6._0_8_ >> 0x20 == 0x42) {
      angband_color_table[colors_modify::a][3] = angband_color_table[colors_modify::a][3] + 0xff;
    }
    else {
      kVar1 = kVar6.code;
      if (kVar1 == 0x47) {
        angband_color_table[colors_modify::a][2] = angband_color_table[colors_modify::a][2] + 0xff;
      }
      else if (kVar1 == 0x4b) {
        angband_color_table[colors_modify::a][0] = angband_color_table[colors_modify::a][0] + 0xff;
      }
      else if (kVar1 == 0x4e) {
        colors_modify::a = colors_modify::a - 1;
        if (0x1e < colors_modify::a) {
          colors_modify::a = '\x1f';
        }
      }
      else if (kVar1 == 0x52) {
        angband_color_table[colors_modify::a][1] = angband_color_table[colors_modify::a][1] + 0xff;
      }
      else if (kVar1 == 0x62) {
        angband_color_table[colors_modify::a][3] = angband_color_table[colors_modify::a][3] + '\x01'
        ;
      }
      else if (kVar1 == 0x67) {
        angband_color_table[colors_modify::a][2] = angband_color_table[colors_modify::a][2] + '\x01'
        ;
      }
      else if (kVar1 == 0x6b) {
        angband_color_table[colors_modify::a][0] = angband_color_table[colors_modify::a][0] + '\x01'
        ;
      }
      else if (kVar1 == 0x6e) {
        colors_modify::a = colors_modify::a + 1;
        if (0x1f < colors_modify::a) {
          colors_modify::a = '\0';
        }
      }
      else if (kVar1 == 0x72) {
        angband_color_table[colors_modify::a][1] = angband_color_table[colors_modify::a][1] + '\x01'
        ;
      }
      else if (kVar1 == 0xe000) {
        return;
      }
    }
    Term_xtra(L'\n',L'\0');
    Term_redraw();
  } while( true );
}

Assistant:

static void colors_modify(const char *title, int row)
{
	int i;

	static uint8_t a = 0;

	/* Prompt */
	prt("Command: Modify colors", 8, 0);

	/* Hack -- query until done */
	while (1) {
		const char *name;
		char index;

		struct keypress cx;

		/* Clear */
		clear_from(10);

		/* Exhibit the normal colors */
		for (i = 0; i < BASIC_COLORS; i++) {
			/* Exhibit this color */
			Term_putstr(i*3, 20, -1, a, "##");

			/* Exhibit character letter */
			Term_putstr(i*3, 21, -1, (uint8_t)i,
						format(" %c", color_table[i].index_char));

			/* Exhibit all colors */
			Term_putstr(i*3, 22, -1, (uint8_t)i, format("%2d", i));
		}

		/* Describe the color */
		name = ((a < BASIC_COLORS) ? color_table[a].name : "undefined");
		index = ((a < BASIC_COLORS) ? color_table[a].index_char : '?');

		/* Describe the color */
		Term_putstr(5, 10, -1, COLOUR_WHITE,
					format("Color = %d, Name = %s, Index = %c",
						   a, name, index));

		/* Label the Current values */
		Term_putstr(5, 12, -1, COLOUR_WHITE,
				format("K = 0x%02x / R,G,B = 0x%02x,0x%02x,0x%02x",
				   angband_color_table[a][0],
				   angband_color_table[a][1],
				   angband_color_table[a][2],
				   angband_color_table[a][3]));

		/* Prompt */
		Term_putstr(0, 14, -1, COLOUR_WHITE,
				"Command (n/N/k/K/r/R/g/G/b/B): ");

		/* Get a command */
		cx = inkey();

		/* All done */
		if (cx.code == ESCAPE) break;

		/* Analyze */
		if (cx.code == 'n') {
			a = (uint8_t)(a + 1);
			if (a >= MAX_COLORS) {
				a = 0;
			}
		}
		if (cx.code == 'N') {
			a = (uint8_t)(a - 1);
			if (a >= MAX_COLORS) {
				a = MAX_COLORS - 1;
			}
		}
		if (cx.code == 'k')
			angband_color_table[a][0] =
				(uint8_t)(angband_color_table[a][0] + 1);
		if (cx.code == 'K')
			angband_color_table[a][0] =
				(uint8_t)(angband_color_table[a][0] - 1);
		if (cx.code == 'r')
			angband_color_table[a][1] =
				(uint8_t)(angband_color_table[a][1] + 1);
		if (cx.code == 'R')
			angband_color_table[a][1] =
				(uint8_t)(angband_color_table[a][1] - 1);
		if (cx.code == 'g')
			angband_color_table[a][2] =
				(uint8_t)(angband_color_table[a][2] + 1);
		if (cx.code == 'G')
			angband_color_table[a][2] =
				(uint8_t)(angband_color_table[a][2] - 1);
		if (cx.code == 'b')
			angband_color_table[a][3] =
				(uint8_t)(angband_color_table[a][3] + 1);
		if (cx.code == 'B')
			angband_color_table[a][3] =
				(uint8_t)(angband_color_table[a][3] - 1);

		/* Hack -- react to changes */
		Term_xtra(TERM_XTRA_REACT, 0);

		/* Hack -- redraw */
		Term_redraw();
	}
}